

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O1

Fluid_Image * Fluid_Image::find(char *iname)

{
  int iVar1;
  Fluid_Image **ppFVar2;
  int iVar3;
  FILE *__stream;
  Fluid_Image *pFVar4;
  char *pcVar5;
  Fl_Shared_Image *pFVar6;
  int *piVar7;
  Fluid_Image *unaff_RBP;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  
  ppFVar2 = images;
  if ((iname == (char *)0x0) || (uVar10 = 0, uVar11 = numimages, *iname == '\0')) {
LAB_0018f7ad:
    unaff_RBP = (Fluid_Image *)0x0;
  }
  else {
    do {
      if ((int)uVar11 <= (int)uVar10) {
        goto_source_dir();
        __stream = (FILE *)fl_fopen(iname,"rb");
        if (__stream == (FILE *)0x0) {
          piVar7 = __errno_location();
          pcVar5 = strerror(*piVar7);
          read_error("%s : %s",iname,pcVar5);
          leave_source_dir();
          return (Fluid_Image *)0x0;
        }
        fclose(__stream);
        pFVar4 = (Fluid_Image *)operator_new(0x28);
        pcVar5 = strdup(iname);
        pFVar4->name_ = pcVar5;
        pFVar4->written = 0;
        pFVar4->refcount = 0;
        pFVar6 = Fl_Shared_Image::get(iname,0,0);
        pFVar4->img = pFVar6;
        pFVar4->function_name_ = (char *)0x0;
        if (((pFVar6 == (Fl_Shared_Image *)0x0) || ((pFVar6->super_Fl_Image).w_ == 0)) ||
           ((pFVar6->super_Fl_Image).h_ == 0)) {
          ~Fluid_Image(pFVar4);
          operator_delete(pFVar4,0x28);
          pFVar4 = (Fluid_Image *)0x0;
          read_error("%s : unrecognized image format",iname);
        }
        leave_source_dir();
        iVar3 = numimages;
        if (pFVar4 != (Fluid_Image *)0x0) {
          lVar12 = (long)numimages;
          iVar8 = numimages + 1;
          bVar13 = tablesize <= numimages;
          numimages = iVar8;
          if (bVar13) {
            iVar1 = tablesize * 2;
            bVar13 = tablesize != 0;
            tablesize = 0x10;
            if (bVar13) {
              tablesize = iVar1;
            }
            if (images == (Fluid_Image **)0x0) {
              images = (Fluid_Image **)malloc((long)tablesize << 3);
            }
            else {
              images = (Fluid_Image **)realloc(images,(long)tablesize << 3);
            }
          }
          ppFVar2 = images;
          if ((int)uVar10 < iVar3) {
            do {
              ppFVar2[lVar12] = ppFVar2[(long)iVar8 + -2];
              lVar12 = lVar12 + -1;
              iVar8 = iVar8 + -1;
            } while ((long)(ulong)uVar10 < lVar12);
          }
          images[uVar10] = pFVar4;
          return pFVar4;
        }
        goto LAB_0018f7ad;
      }
      uVar9 = uVar10 + uVar11 >> 1;
      pFVar4 = ppFVar2[uVar9];
      iVar3 = strcmp(iname,pFVar4->name_);
      bVar13 = true;
      if (-1 < iVar3) {
        if (iVar3 == 0) {
          bVar13 = false;
          unaff_RBP = pFVar4;
          uVar9 = uVar11;
        }
        else {
          uVar10 = uVar9 + 1;
          uVar9 = uVar11;
        }
      }
      uVar11 = uVar9;
    } while (bVar13);
  }
  return unaff_RBP;
}

Assistant:

Fluid_Image* Fluid_Image::find(const char *iname) {
  if (!iname || !*iname) return 0;

  // first search to see if it exists already:
  int a = 0;
  int b = numimages;
  while (a < b) {
    int c = (a+b)/2;
    int i = strcmp(iname,images[c]->name_);
    if (i < 0) b = c;
    else if (i > 0) a = c+1;
    else return images[c];
  }

  // no, so now see if the file exists:

  goto_source_dir();
  FILE *f = fl_fopen(iname,"rb");
  if (!f) {
    read_error("%s : %s",iname,strerror(errno));
    leave_source_dir();
    return 0;
  }
  fclose(f);

  Fluid_Image *ret = new Fluid_Image(iname);

  if (!ret->img || !ret->img->w() || !ret->img->h()) {
    delete ret;
    ret = 0;
    read_error("%s : unrecognized image format", iname);
  }
  leave_source_dir();
  if (!ret) return 0;

  // make a new entry in the table:
  numimages++;
  if (numimages > tablesize) {
    tablesize = tablesize ? 2*tablesize : 16;
    if (images) images = (Fluid_Image**)realloc(images, tablesize*sizeof(Fluid_Image*));
    else images = (Fluid_Image**)malloc(tablesize*sizeof(Fluid_Image*));
  }
  for (b = numimages-1; b > a; b--) images[b] = images[b-1];
  images[a] = ret;

  return ret;
}